

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto3_arena_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::Proto3OptionalTest_ClearNonOptionalMessageField_Test::
~Proto3OptionalTest_ClearNonOptionalMessageField_Test
          (Proto3OptionalTest_ClearNonOptionalMessageField_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Proto3OptionalTest, ClearNonOptionalMessageField) {
  proto2_unittest::TestProto3OptionalMessage msg;
  msg.mutable_nested_message();
  const google::protobuf::Descriptor* d = msg.GetDescriptor();
  const google::protobuf::Reflection* r = msg.GetReflection();
  const google::protobuf::FieldDescriptor* f = d->FindFieldByName("nested_message");
  r->ClearField(&msg, f);
}